

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseWheel(void)

{
  bool bVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  float local_b0;
  float local_ac;
  float local_a4;
  ImGuiWindow *local_98;
  float scroll_step_1;
  float max_step_1;
  float wheel_x;
  float scroll_step;
  float max_step;
  float wheel_y;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 offset;
  float scale;
  float new_font_scale;
  ImGuiWindow *window;
  ImGuiContext *local_10;
  ImGuiContext *g;
  
  local_10 = GImGui;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar1 = IsMousePosValid((ImVec2 *)0x0);
    bVar2 = false;
    if (bVar1) {
      window = (ImGuiWindow *)
               operator-(&(local_10->IO).MousePos,&local_10->WheelingWindowRefMousePos);
      fVar3 = ImLengthSqr((ImVec2 *)&window);
      bVar2 = (local_10->IO).MouseDragThreshold * (local_10->IO).MouseDragThreshold < fVar3;
    }
    if (bVar2) {
      local_10->WheelingWindowTimer = 0.0;
    }
    if (local_10->WheelingWindowTimer <= 0.0) {
      local_10->WheelingWindow = (ImGuiWindow *)0x0;
      local_10->WheelingWindowTimer = 0.0;
    }
  }
  fVar3 = (local_10->IO).MouseWheel;
  if ((((fVar3 != 0.0) || (NAN(fVar3))) || (fVar3 = (local_10->IO).MouseWheelH, fVar3 != 0.0)) ||
     (NAN(fVar3))) {
    if (local_10->WheelingWindow == (ImGuiWindow *)0x0) {
      local_98 = local_10->HoveredWindow;
    }
    else {
      local_98 = local_10->WheelingWindow;
    }
    _scale = local_98;
    if ((local_98 != (ImGuiWindow *)0x0) && ((local_98->Collapsed & 1U) == 0)) {
      fVar3 = (local_10->IO).MouseWheel;
      if (((fVar3 == 0.0) && (!NAN(fVar3))) ||
         ((((local_10->IO).KeyCtrl & 1U) == 0 || (((local_10->IO).FontAllowUserScaling & 1U) == 0)))
         ) {
        fVar3 = (local_10->IO).MouseWheel;
        if (((fVar3 == 0.0) && (!NAN(fVar3))) || (((local_10->IO).KeyShift & 1U) != 0)) {
          local_a4 = 0.0;
        }
        else {
          local_a4 = (local_10->IO).MouseWheel;
        }
        if (((local_a4 != 0.0) || (NAN(local_a4))) && (((local_10->IO).KeyCtrl & 1U) == 0)) {
          StartLockWheelingWindow(local_98);
          while( true ) {
            bVar2 = false;
            if ((_scale->Flags & 0x1000000U) != 0) {
              fVar3 = (_scale->ScrollMax).y;
              bVar2 = true;
              if (((fVar3 != 0.0) || (NAN(fVar3))) && (bVar2 = false, (_scale->Flags & 0x10U) != 0))
              {
                bVar2 = (_scale->Flags & 0x200U) == 0;
              }
            }
            if (!bVar2) break;
            _scale = _scale->ParentWindow;
          }
          if (((_scale->Flags & 0x10U) == 0) && ((_scale->Flags & 0x200U) == 0)) {
            fVar3 = ImRect::GetHeight(&_scale->InnerRect);
            fVar4 = ImGuiWindow::CalcFontSize(_scale);
            fVar3 = ImMin<float>(fVar4 * 5.0,fVar3 * 0.67);
            fVar3 = ImFloor(fVar3);
            SetScrollY(_scale,-local_a4 * fVar3 + (_scale->Scroll).y);
          }
        }
        fVar3 = (local_10->IO).MouseWheelH;
        if (((fVar3 == 0.0) && (!NAN(fVar3))) || (((local_10->IO).KeyShift & 1U) != 0)) {
          fVar3 = (local_10->IO).MouseWheel;
          if (((fVar3 == 0.0) && (!NAN(fVar3))) || (((local_10->IO).KeyShift & 1U) == 0)) {
            local_b0 = 0.0;
          }
          else {
            local_b0 = (local_10->IO).MouseWheel;
          }
          local_ac = local_b0;
        }
        else {
          local_ac = (local_10->IO).MouseWheelH;
        }
        if (((local_ac != 0.0) || (NAN(local_ac))) && (((local_10->IO).KeyCtrl & 1U) == 0)) {
          StartLockWheelingWindow(_scale);
          while( true ) {
            bVar2 = false;
            if ((_scale->Flags & 0x1000000U) != 0) {
              fVar3 = (_scale->ScrollMax).x;
              bVar2 = true;
              if (((fVar3 != 0.0) || (NAN(fVar3))) && (bVar2 = false, (_scale->Flags & 0x10U) != 0))
              {
                bVar2 = (_scale->Flags & 0x200U) == 0;
              }
            }
            if (!bVar2) break;
            _scale = _scale->ParentWindow;
          }
          if (((_scale->Flags & 0x10U) == 0) && ((_scale->Flags & 0x200U) == 0)) {
            fVar3 = ImRect::GetWidth(&_scale->InnerRect);
            fVar4 = ImGuiWindow::CalcFontSize(_scale);
            fVar3 = ImMin<float>(fVar4 * 2.0,fVar3 * 0.67);
            fVar3 = ImFloor(fVar3);
            SetScrollX(_scale,-local_ac * fVar3 + (_scale->Scroll).x);
          }
        }
      }
      else {
        StartLockWheelingWindow(local_98);
        offset.y = ImClamp<float>((local_10->IO).MouseWheel * 0.1 + local_98->FontWindowScale,0.5,
                                  2.5);
        offset.x = offset.y / local_98->FontWindowScale;
        local_98->FontWindowScale = offset.y;
        if ((local_98->Flags & 0x1000000U) == 0) {
          local_40 = operator*(&local_98->Size,1.0 - offset.x);
          local_48 = operator-(&(local_10->IO).MousePos,&local_98->Pos);
          local_38 = operator*(&local_40,&local_48);
          local_30 = operator/(&local_38,&local_98->Size);
          local_50 = operator+(&local_98->Pos,&local_30);
          SetWindowPos(local_98,&local_50,0);
          local_60 = operator*(&local_98->Size,offset.x);
          local_58 = ImFloor(&local_60);
          local_98->Size = local_58;
          _max_step = operator*(&local_98->SizeFull,offset.x);
          IVar5 = ImFloor((ImVec2 *)&max_step);
          local_98->SizeFull = IVar5;
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseWheel()
{
    ImGuiContext& g = *GImGui;

    // Reset the locked window if we move the mouse or after the timer elapses
    if (g.WheelingWindow != NULL)
    {
        g.WheelingWindowTimer -= g.IO.DeltaTime;
        if (IsMousePosValid() && ImLengthSqr(g.IO.MousePos - g.WheelingWindowRefMousePos) > g.IO.MouseDragThreshold * g.IO.MouseDragThreshold)
            g.WheelingWindowTimer = 0.0f;
        if (g.WheelingWindowTimer <= 0.0f)
        {
            g.WheelingWindow = NULL;
            g.WheelingWindowTimer = 0.0f;
        }
    }

    if (g.IO.MouseWheel == 0.0f && g.IO.MouseWheelH == 0.0f)
        return;

    ImGuiWindow* window = g.WheelingWindow ? g.WheelingWindow : g.HoveredWindow;
    if (!window || window->Collapsed)
        return;

    // Zoom / Scale window
    // FIXME-OBSOLETE: This is an old feature, it still works but pretty much nobody is using it and may be best redesigned.
    if (g.IO.MouseWheel != 0.0f && g.IO.KeyCtrl && g.IO.FontAllowUserScaling)
    {
        StartLockWheelingWindow(window);
        const float new_font_scale = ImClamp(window->FontWindowScale + g.IO.MouseWheel * 0.10f, 0.50f, 2.50f);
        const float scale = new_font_scale / window->FontWindowScale;
        window->FontWindowScale = new_font_scale;
        if (!(window->Flags & ImGuiWindowFlags_ChildWindow))
        {
            const ImVec2 offset = window->Size * (1.0f - scale) * (g.IO.MousePos - window->Pos) / window->Size;
            SetWindowPos(window, window->Pos + offset, 0);
            window->Size = ImFloor(window->Size * scale);
            window->SizeFull = ImFloor(window->SizeFull * scale);
        }
        return;
    }

    // Mouse wheel scrolling
    // If a child window has the ImGuiWindowFlags_NoScrollWithMouse flag, we give a chance to scroll its parent

    // Vertical Mouse Wheel scrolling
    const float wheel_y = (g.IO.MouseWheel != 0.0f && !g.IO.KeyShift) ? g.IO.MouseWheel : 0.0f;
    if (wheel_y != 0.0f && !g.IO.KeyCtrl)
    {
        StartLockWheelingWindow(window);
        while ((window->Flags & ImGuiWindowFlags_ChildWindow) && ((window->ScrollMax.y == 0.0f) || ((window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(window->Flags & ImGuiWindowFlags_NoMouseInputs))))
            window = window->ParentWindow;
        if (!(window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(window->Flags & ImGuiWindowFlags_NoMouseInputs))
        {
            float max_step = window->InnerRect.GetHeight() * 0.67f;
            float scroll_step = ImFloor(ImMin(5 * window->CalcFontSize(), max_step));
            SetScrollY(window, window->Scroll.y - wheel_y * scroll_step);
        }
    }

    // Horizontal Mouse Wheel scrolling, or Vertical Mouse Wheel w/ Shift held
    const float wheel_x = (g.IO.MouseWheelH != 0.0f && !g.IO.KeyShift) ? g.IO.MouseWheelH : (g.IO.MouseWheel != 0.0f && g.IO.KeyShift) ? g.IO.MouseWheel : 0.0f;
    if (wheel_x != 0.0f && !g.IO.KeyCtrl)
    {
        StartLockWheelingWindow(window);
        while ((window->Flags & ImGuiWindowFlags_ChildWindow) && ((window->ScrollMax.x == 0.0f) || ((window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(window->Flags & ImGuiWindowFlags_NoMouseInputs))))
            window = window->ParentWindow;
        if (!(window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(window->Flags & ImGuiWindowFlags_NoMouseInputs))
        {
            float max_step = window->InnerRect.GetWidth() * 0.67f;
            float scroll_step = ImFloor(ImMin(2 * window->CalcFontSize(), max_step));
            SetScrollX(window, window->Scroll.x - wheel_x * scroll_step);
        }
    }
}